

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

AsmJsFunctionInfo * __thiscall Js::FunctionBody::AllocateAsmJsFunctionInfo(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  void *pvVar3;
  undefined4 *puVar4;
  Recycler *alloc;
  undefined8 *ptr;
  AsmJsFunctionInfo *pAVar5;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  pvVar3 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,AsmJsFunctionInfo);
  if (pvVar3 != (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x198f,"(!this->GetAsmJsFunctionInfo())",
                                "!this->GetAsmJsFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_48 = (undefined1  [8])&AsmJsFunctionInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab601b;
  data.filename._0_4_ = 0x1990;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     recycler,(TrackAllocData *)local_48);
  ptr = (undefined8 *)new<Memory::Recycler>(0xd0,alloc,0x38bbb2);
  ptr[0xd] = 0;
  *(undefined2 *)(ptr + 0xe) = 0;
  ptr[0xf] = 0;
  *(undefined2 *)(ptr + 0x10) = 0;
  *ptr = 0;
  ptr[1] = 0;
  ptr[2] = 0;
  ptr[3] = 0;
  ptr[4] = 0;
  ptr[5] = 0;
  ptr[6] = 0;
  ptr[7] = 0;
  ptr[8] = 0;
  ptr[9] = 0;
  ptr[10] = 0;
  ptr[0xb] = 0;
  *(undefined8 *)((long)ptr + 0x5e) = 0;
  AsmJsRetType::AsmJsRetType((AsmJsRetType *)((long)ptr + 0x84),Void);
  *(undefined8 *)((long)ptr + 0x91) = 0;
  *(undefined8 *)((long)ptr + 0x99) = 0;
  ptr[0x11] = 0;
  ptr[0x12] = 0;
  ptr[0x15] = 0;
  ptr[0x16] = 0;
  *(undefined4 *)(ptr + 0x17) = 0;
  ptr[0x18] = 0;
  ptr[0x19] = 0;
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,AsmJsFunctionInfo,ptr);
  pAVar5 = (AsmJsFunctionInfo *)FunctionProxy::GetAuxPtr((FunctionProxy *)this,AsmJsFunctionInfo);
  return pAVar5;
}

Assistant:

AsmJsFunctionInfo* FunctionBody::AllocateAsmJsFunctionInfo()
    {
        Assert( !this->GetAsmJsFunctionInfo() );
        this->SetAuxPtr<AuxPointerType::AsmJsFunctionInfo>(RecyclerNew( m_scriptContext->GetRecycler(), AsmJsFunctionInfo));
        return this->GetAsmJsFunctionInfo();
    }